

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detonation_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Detonation_PDU::ClearVariableParameters(Detonation_PDU *this)

{
  Detonation_PDU *this_local;
  
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ::clear(&this->m_vVariableParameters);
  this->m_ui8NumOfVariableParams = '\0';
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui16PDULength = 0x68;
  return;
}

Assistant:

void Detonation_PDU::ClearVariableParameters()
{
    m_vVariableParameters.clear();
    m_ui8NumOfVariableParams = 0;
    m_ui16PDULength = DETONATION_PDU_SIZE;
}